

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtilsSystemSpecific.cpp
# Opt level: O2

string * ApprovalTests::FileUtilsSystemSpecific::getCommandLineForCopy
                   (string *__return_storage_ptr__,string *source,string *destination,bool isWindows
                   )

{
  undefined3 in_register_00000009;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (CONCAT31(in_register_00000009,isWindows) == 0) {
    ::std::__cxx11::string::string((string *)&local_b8,"cp ",&local_b9);
    ::std::operator+(&local_98,&local_b8,"\"");
    ::std::operator+(&local_78,&local_98,source);
    ::std::operator+(&local_58,&local_78,"\" \"");
    ::std::operator+(&local_38,&local_58,destination);
    ::std::operator+(__return_storage_ptr__,&local_38,"\"");
  }
  else {
    ::std::__cxx11::string::string((string *)&local_b8,"copy /Y ",&local_b9);
    ::std::operator+(&local_98,&local_b8,"\"");
    ::std::operator+(&local_78,&local_98,source);
    ::std::operator+(&local_58,&local_78,"\" \"");
    ::std::operator+(&local_38,&local_58,destination);
    ::std::operator+(__return_storage_ptr__,&local_38,"\"");
  }
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FileUtilsSystemSpecific::getCommandLineForCopy(
        const std::string& source, const std::string& destination, bool isWindows)
    {
        if (isWindows)
        {
            return std::string("copy /Y ") + "\"" + source + "\" \"" + destination + "\"";
        }
        else
        {
            return std::string("cp ") + "\"" + source + "\" \"" + destination + "\"";
        }
    }